

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::insert
          (iterator *this,int left,int right,int *value,allocator_type *alloc)

{
  IndexPair offset_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  IndexPair IVar4;
  interval<int> *key;
  uint32_t *puVar5;
  long *in_RDI;
  uint32_t size;
  allocator_type *in_stack_00000040;
  IndexPair offset;
  uint32_t size_1;
  interval<int> ival;
  Path *path;
  IntervalMap<int,_int,_0U> *map;
  allocator_type *in_stack_ffffffffffffff78;
  const_iterator *in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  Path *in_stack_ffffffffffffff90;
  LeafNode<int,_int,_16U,_true> *in_stack_ffffffffffffff98;
  LeafNode<int,_int,_16U,_true> *pLVar6;
  LeafNode<int,_int,_16U,_true> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  
  pLVar6 = (LeafNode<int,_int,_16U,_true> *)*in_RDI;
  bVar1 = IntervalMap<int,_int,_0U>::const_iterator::isFlat(in_stack_ffffffffffffff80);
  uVar3 = (uint32_t)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    in_stack_ffffffffffffffa0 = pLVar6;
    IntervalMapDetails::Path::leafOffset((Path *)0x823a14);
    uVar2 = IntervalMapDetails::LeafNode<int,_int,_16U,_true>::insertFrom
                      (in_stack_ffffffffffffff98,
                       (uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (uint32_t)in_stack_ffffffffffffff90,
                       (interval<int> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (int *)in_stack_ffffffffffffff80);
    if (uVar2 < 0x11) {
      pLVar6[1].super_NodeBase<slang::IntervalMapDetails::interval<int>,_int,_16U>.first[0].right =
           uVar2;
      IntervalMapDetails::Path::setSize
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      return;
    }
    IntervalMapDetails::Path::leafOffset((Path *)0x823a78);
    IVar4 = switchToBranch((IntervalMap<int,_int,_0U> *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                           in_stack_ffffffffffffff78);
    offset_00.second = uVar2;
    offset_00.first = IVar4.second;
    IntervalMapDetails::Path::replaceRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>>
              ((Path *)CONCAT44(IVar4.first,IVar4.second),
               (BranchNode<int,_12U,_true> *)CONCAT44(IVar4.first,in_stack_ffffffffffffffb0),uVar3,
               offset_00);
    in_stack_ffffffffffffff98 = pLVar6;
  }
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  bVar1 = IntervalMapDetails::Path::valid(in_stack_ffffffffffffff90);
  if (!bVar1) {
    IntervalMapDetails::Path::legalizeForInsert((Path *)in_stack_ffffffffffffff80,uVar3);
  }
  IntervalMapDetails::Path::leafSize((Path *)0x823ae7);
  key = (interval<int> *)
        IntervalMapDetails::Path::leaf<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                  ((Path *)0x823af5);
  IntervalMapDetails::Path::leafOffset((Path *)0x823b04);
  uVar3 = IntervalMapDetails::LeafNode<int,_int,_16U,_false>::insertFrom
                    ((LeafNode<int,_int,_16U,_false> *)in_stack_ffffffffffffff98,
                     (uint32_t)((ulong)key >> 0x20),(uint32_t)key,
                     (interval<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (int *)in_stack_ffffffffffffff80);
  if (0x10 < uVar3) {
    IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff80);
    IntervalMap<int,int,0u>::iterator::
    overflow<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
              ((iterator *)ival,size_1,in_stack_00000040);
    in_stack_ffffffffffffff80 =
         (const_iterator *)
         IntervalMapDetails::Path::leaf<slang::IntervalMapDetails::LeafNode<int,int,16u,false>>
                   ((Path *)0x823b4e);
    puVar5 = IntervalMapDetails::Path::leafOffset((Path *)0x823b5d);
    in_stack_ffffffffffffff8c = *puVar5;
    IntervalMapDetails::Path::leafSize((Path *)0x823b6d);
    IntervalMapDetails::LeafNode<int,_int,_16U,_false>::insertFrom
              ((LeafNode<int,_int,_16U,_false> *)in_stack_ffffffffffffff98,
               (uint32_t)((ulong)key >> 0x20),(uint32_t)key,
               (interval<int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (int *)in_stack_ffffffffffffff80);
  }
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff80);
  IntervalMapDetails::Path::setSize((Path *)key,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
  ;
  IntervalMapDetails::Path::height((Path *)in_stack_ffffffffffffff80);
  updateParentBounds((iterator *)in_stack_ffffffffffffffa0,uVar3,key);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::insert(TKey left, TKey right, const TValue& value,
                                                    allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;

    interval<TKey> ival{left, right};
    if (this->isFlat()) {
        // Try simple root leaf insert first.
        uint32_t size = map.rootLeaf.insertFrom(path.leafOffset(), map.rootSize, ival, value);
        if (size <= RootLeaf::Capacity) {
            map.rootSize = size;
            path.setSize(0, size);
            return;
        }

        // Root is full, we need to branch.
        auto offset = map.switchToBranch(path.leafOffset(), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, offset);
    }

    if (!path.valid())
        path.legalizeForInsert(this->map->height);

    uint32_t size = path.leafSize();
    size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), size, ival, value);

    if (size > Leaf::Capacity) {
        // If the new element didn't fit, overflow the node and try again.
        overflow<Leaf>(path.height(), alloc);
        size = path.template leaf<Leaf>().insertFrom(path.leafOffset(), path.leafSize(), ival,
                                                     value);
    }

    // Update path to match the newly inserted element.
    path.setSize(path.height(), size);
    updateParentBounds(path.height(), ival);
}